

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

carray<long,_2UL> frozen::knuth_morris_pratt_searcher<2UL>::build_kmp_cache(char (*needle) [3])

{
  value_type_conflict3 vVar1;
  size_t sVar2;
  reference pvVar3;
  size_t *psVar4;
  bool bVar5;
  ulong local_38;
  size_t pos;
  size_t local_28;
  ptrdiff_t cnd;
  char (*needle_local) [3];
  carray<long,_2UL> cache;
  
  local_28 = 0;
  pos = 0xffffffffffffffff;
  cnd = (ptrdiff_t)needle;
  bits::carray<long,_2UL>::carray((carray<long,_2UL> *)&needle_local,(value_type_conflict3 *)&pos);
  for (local_38 = 1; sVar2 = local_28, local_38 < 2; local_38 = local_38 + 1) {
    if (*(char *)(cnd + local_38) == *(char *)(cnd + local_28)) {
      pvVar3 = bits::carray<long,_2UL>::operator[]((carray<long,_2UL> *)&needle_local,local_28);
      vVar1 = *pvVar3;
      pvVar3 = bits::carray<long,_2UL>::operator[]((carray<long,_2UL> *)&needle_local,local_38);
      *pvVar3 = vVar1;
    }
    else {
      psVar4 = (size_t *)
               bits::carray<long,_2UL>::operator[]((carray<long,_2UL> *)&needle_local,local_38);
      *psVar4 = sVar2;
      psVar4 = (size_t *)
               bits::carray<long,_2UL>::operator[]((carray<long,_2UL> *)&needle_local,local_28);
      local_28 = *psVar4;
      while( true ) {
        bVar5 = false;
        if (-1 < (long)local_28) {
          bVar5 = *(char *)(cnd + local_38) != *(char *)(cnd + local_28);
        }
        if (!bVar5) break;
        psVar4 = (size_t *)
                 bits::carray<long,_2UL>::operator[]((carray<long,_2UL> *)&needle_local,local_28);
        local_28 = *psVar4;
      }
    }
    local_28 = local_28 + 1;
  }
  return (carray<long,_2UL>)_needle_local;
}

Assistant:

static constexpr bits::carray<std::ptrdiff_t, size>
  build_kmp_cache(char const (&needle)[size + 1]) {
    std::ptrdiff_t cnd = 0;
    bits::carray<std::ptrdiff_t, size> cache(-1);
    for (std::size_t pos = 1; pos < size; ++pos) {
      if (needle[pos] == needle[cnd]) {
        cache[pos] = cache[cnd];
        cnd += 1;
      } else {
        cache[pos] = cnd;
        cnd = cache[cnd];
        while (cnd >= 0 && needle[pos] != needle[cnd])
          cnd = cache[cnd];
        cnd += 1;
      }
    }
    return cache;
  }